

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int hkdf_expand_label(ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t secret,
                     char *label,ptls_iovec_t hash_value,char *label_prefix)

{
  ptls_iovec_t info;
  ptls_iovec_t prk;
  uint8_t *__ptr;
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  uint8_t hkdf_label_buf [80];
  ptls_buffer_t local_e8;
  size_t local_c0;
  ptls_hash_algorithm_t *local_b8;
  void *local_b0;
  uint8_t *local_a8;
  size_t local_a0;
  uint8_t *local_98;
  size_t sStack_90;
  uint8_t local_88 [88];
  
  local_a0 = secret.len;
  local_a8 = secret.base;
  if (label_prefix == (char *)0x0) {
    __assert_fail("label_prefix != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x1431,
                  "int hkdf_expand_label(ptls_hash_algorithm_t *, void *, size_t, ptls_iovec_t, const char *, ptls_iovec_t, const char *)"
                 );
  }
  local_e8.base = local_88;
  local_e8.off = 0;
  local_e8.capacity = 0x50;
  local_e8._24_8_ = local_e8._24_8_ & 0xffffffff00000000;
  local_b8 = algo;
  local_b0 = output;
  iVar3 = ptls_buffer_reserve(&local_e8,2);
  if (iVar3 == 0) {
    *(ushort *)(local_e8.base + local_e8.off) = (ushort)outlen << 8 | (ushort)outlen >> 8;
    local_e8.off = local_e8.off + 2;
    iVar3 = 0;
  }
  if (iVar3 == 0) {
    iVar3 = ptls_buffer_reserve(&local_e8,1);
    if (iVar3 == 0) {
      local_e8.base[local_e8.off] = '\0';
      local_e8.off = local_e8.off + 1;
      iVar3 = 0;
    }
    iVar5 = 6;
    if (iVar3 == 0) {
      local_c0 = local_e8.off;
      sVar4 = strlen(label_prefix);
      iVar3 = 0;
      if ((sVar4 != 0) &&
         (iVar3 = ptls_buffer_reserve(&local_e8,sVar4), sVar1 = local_e8.off, iVar3 == 0)) {
        memcpy(local_e8.base + local_e8.off,label_prefix,sVar4);
        local_e8.off = sVar4 + sVar1;
        iVar3 = 0;
      }
      if (iVar3 == 0) {
        sVar4 = strlen(label);
        iVar3 = 0;
        if ((sVar4 != 0) &&
           (iVar3 = ptls_buffer_reserve(&local_e8,sVar4), sVar1 = local_e8.off, iVar3 == 0)) {
          memcpy(local_e8.base + local_e8.off,label,sVar4);
          local_e8.off = sVar4 + sVar1;
          iVar3 = 0;
        }
        if (iVar3 == 0) {
          local_e8.base[local_c0 - 1] = (char)local_e8.off - (char)local_c0;
          iVar5 = 0;
          iVar3 = 0;
        }
      }
    }
    if (iVar5 != 6) {
      if (iVar5 != 0) {
        return iVar3;
      }
      iVar3 = ptls_buffer_reserve(&local_e8,1);
      if (iVar3 == 0) {
        local_e8.base[local_e8.off] = '\0';
        local_e8.off = local_e8.off + 1;
        iVar3 = 0;
      }
      sVar1 = local_e8.off;
      iVar5 = 6;
      if (iVar3 == 0) {
        iVar3 = 0;
        if ((hash_value.len != 0) &&
           (iVar3 = ptls_buffer_reserve(&local_e8,hash_value.len), sVar2 = local_e8.off, iVar3 == 0)
           ) {
          memcpy(local_e8.base + local_e8.off,hash_value.base,hash_value.len);
          local_e8.off = sVar2 + hash_value.len;
          iVar3 = 0;
        }
        if (iVar3 == 0) {
          local_e8.base[sVar1 - 1] = (char)local_e8.off - (char)sVar1;
          iVar5 = 0;
          iVar3 = 0;
        }
      }
      if (iVar5 != 6) {
        if (iVar5 != 0) {
          return iVar3;
        }
        local_98 = local_e8.base;
        sStack_90 = local_e8.off;
        prk.len = local_a0;
        prk.base = local_a8;
        info.len = local_e8.off;
        info.base = local_e8.base;
        iVar3 = ptls_hkdf_expand(local_b8,local_b0,outlen,prk,info);
      }
    }
  }
  __ptr = local_e8.base;
  (*ptls_clear_memory)(local_e8.base,local_e8.off);
  if (local_e8.is_allocated != 0) {
    free(__ptr);
  }
  return iVar3;
}

Assistant:

int hkdf_expand_label(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t secret, const char *label,
                      ptls_iovec_t hash_value, const char *label_prefix)
{
    ptls_buffer_t hkdf_label;
    uint8_t hkdf_label_buf[80];
    int ret;

    assert(label_prefix != NULL);

    ptls_buffer_init(&hkdf_label, hkdf_label_buf, sizeof(hkdf_label_buf));

    ptls_buffer_push16(&hkdf_label, (uint16_t)outlen);
    ptls_buffer_push_block(&hkdf_label, 1, {
        ptls_buffer_pushv(&hkdf_label, label_prefix, strlen(label_prefix));
        ptls_buffer_pushv(&hkdf_label, label, strlen(label));
    });
    ptls_buffer_push_block(&hkdf_label, 1, { ptls_buffer_pushv(&hkdf_label, hash_value.base, hash_value.len); });

    ret = ptls_hkdf_expand(algo, output, outlen, secret, ptls_iovec_init(hkdf_label.base, hkdf_label.off));

Exit:
    ptls_buffer_dispose(&hkdf_label);
    return ret;
}